

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

void __thiscall front::syntax::SyntaxAnalyze::gm_while_stmt_normal(SyntaxAnalyze *this)

{
  irGenerator *this_00;
  undefined8 uVar1;
  undefined8 this_01;
  LabelId bbTrue;
  uint uVar2;
  LabelId label;
  WhileLabels wl;
  bool bVar3;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> condStr
  ;
  string tmpName;
  anon_class_1_0_00000001 local_151;
  ulong local_150;
  long *local_148;
  long local_140;
  long local_138 [2];
  char local_128;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_120;
  bool local_100;
  string local_f8;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  byte local_b8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a8;
  bool local_88;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  byte local_60;
  RightVal local_58;
  
  this_00 = &this->irGenerator;
  bbTrue = irGenerator::irGenerator::getNewLabelId(this_00);
  uVar2 = irGenerator::irGenerator::getNewLabelId(this_00);
  label = irGenerator::irGenerator::getNewLabelId(this_00);
  local_128 = '\0';
  wl._endLabel = uVar2;
  wl._beginLabel = label;
  local_150 = (ulong)uVar2;
  irGenerator::irGenerator::pushWhile(this_00,wl);
  irGenerator::irGenerator::ir_label(this_00,label);
  match_one_word(this,WHILETK);
  match_one_word(this,LPARENT);
  gm_cond((SyntaxAnalyze *)&local_d8._M_first);
  this_01 = local_d8._8_8_;
  uVar1 = local_d8._0_8_;
  local_d8._8_8_ = 0;
  local_d8._0_8_ = 0;
  if (*(int *)uVar1 == 0) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_f8,this_00,Int);
    local_d8._0_8_ = CONCAT44((int)((ulong)local_d8._0_8_ >> 0x20),*(int *)(uVar1 + 8));
    local_b8 = 0;
    std::get<0ul,int,int,std::__cxx11::string>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_d8._M_first);
    local_80._0_8_ = (long)&local_80 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_f8._M_dataplus._M_p,
               local_f8._M_dataplus._M_p + local_f8._M_string_length);
    local_60 = 1;
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_58,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_d8._M_first);
    irGenerator::irGenerator::ir_assign(this_00,(LeftVal *)&local_80._M_first,&local_58);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr
      [local_58.
       super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
              (&local_151,&local_58);
    local_58.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_60]._M_data)
              (&local_151,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_80._M_first);
    local_60 = 0xff;
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&local_148,&local_f8);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_b8]._M_data)
              (&local_151,
               (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_d8._M_first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&local_148,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar1 + 0x10));
  }
  local_100 = false;
  bVar3 = local_128 == '\x01';
  if (bVar3) {
    local_120._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_120._M_value + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_148,local_140 + (long)local_148);
  }
  local_100 = bVar3;
  irGenerator::irGenerator::ir_jump
            (this_00,BrCond,bbTrue,(LabelId)local_150,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_120,Loop);
  if ((local_100 == true) &&
     (local_100 = false,
     local_120._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_120._M_value + 0x10))) {
    operator_delete((void *)local_120._M_value._M_dataplus._M_p,local_120._16_8_ + 1);
  }
  irGenerator::irGenerator::ir_label(this_00,bbTrue);
  match_one_word(this,RPARENT);
  gm_stmt(this);
  local_88 = false;
  irGenerator::irGenerator::ir_jump
            (this_00,Br,label,-1,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8,Loop);
  if ((local_88 == true) &&
     (local_88 = false,
     local_a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a8._M_value + 0x10))) {
    operator_delete((void *)local_a8._M_value._M_dataplus._M_p,local_a8._16_8_ + 1);
  }
  irGenerator::irGenerator::ir_label(this_00,(LabelId)local_150);
  irGenerator::irGenerator::popWhile(this_00);
  if ((local_128 == '\x01') && (local_128 = '\0', local_148 != local_138)) {
    operator_delete(local_148,local_138[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  return;
}

Assistant:

void SyntaxAnalyze::gm_while_stmt_normal() {
  SharedExNdPtr cond;
  LabelId whileTrue = irGenerator.getNewLabelId();
  LabelId whileEnd = irGenerator.getNewLabelId();
  LabelId whileBegin = irGenerator.getNewLabelId();
  std::optional<string> condStr;
  irGenerator::WhileLabels whileLabels =
      irGenerator::WhileLabels(whileBegin, whileEnd);

  irGenerator.pushWhile(whileLabels);
  irGenerator.ir_label(whileBegin);

  match_one_word(Token::WHILETK);
  match_one_word(Token::LPARENT);

  cond = gm_cond();

  if (cond->_type == NodeType::CNS) {
    string tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
    RightVal right;
    right.emplace<0>(cond->_value);
    irGenerator.ir_assign(tmpName, right);
    condStr = tmpName;
  } else {
    condStr = cond->_name;
  }
  irGenerator.ir_jump(mir::inst::JumpInstructionKind::BrCond, whileTrue,
                      whileEnd, condStr, mir::inst::JumpKind::Loop);
  irGenerator.ir_label(whileTrue);

  match_one_word(Token::RPARENT);
  gm_stmt();

  irGenerator.ir_jump(mir::inst::JumpInstructionKind::Br, whileBegin, -1,
                      std::nullopt, mir::inst::JumpKind::Loop);
  irGenerator.ir_label(whileEnd);
  irGenerator.popWhile();
}